

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

bool __thiscall
iffl::
flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
::revalidate_data(flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
                  *this,size_type data_size)

{
  iffl *this_00;
  size_type sVar1;
  size_type sVar2;
  default_validate_element_fn<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
  *in_R8;
  undefined1 local_40 [8];
  pair<bool,_iffl::flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>_>
  local_38;
  
  sVar1 = total_capacity(this);
  sVar2 = data_size;
  if (sVar1 < data_size) {
    sVar2 = sVar1;
  }
  if (data_size == 0xffffffffffffffff) {
    sVar2 = sVar1;
  }
  this_00 = (iffl *)(this->buffer_).v2_.begin;
  flat_forward_list_validate_no_next_offset<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,iffl::default_validate_element_fn<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>>>
            (&local_38,this_00,(char *)(this_00 + sVar2),local_40,in_R8);
  if (local_38.first == true) {
    flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
    ::last((flat_forward_list_ref<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>_>
            *)local_40);
  }
  else {
    local_38.first = false;
    local_40 = (undefined1  [8])0x0;
  }
  (this->buffer_).v2_.last = (pointer_type)local_40;
  return (bool)(local_38.first & 1);
}

Assistant:

[[nodiscard]] bool revalidate_data(size_type data_size = npos) noexcept {
        size_type new_data_size{ total_capacity() };
        if (data_size != npos) {
            new_data_size = std::min(data_size, new_data_size);
        }
        auto[valid, buffer_view] = flat_forward_list_validate<T, TT>(buff().begin, 
                                                                     buff().begin + new_data_size);
        buff().last = valid ? buffer_view.last().get_ptr() : nullptr;

        return valid;
    }